

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExtractEuler.cpp
# Opt level: O1

M44f * anon_unknown.dwarf_4ae81::matrixEulerMatrix_2
                 (M44f *__return_storage_ptr__,M44f *M,Order order)

{
  byte bVar1;
  Euler<float> local_20;
  
  local_20.super_Vec3<float>.x = 0.0;
  local_20.super_Vec3<float>.y = 0.0;
  local_20.super_Vec3<float>.z = 0.0;
  bVar1 = 0x10;
  if ((order >> 0xd & 1) == 0) {
    bVar1 = (byte)(order >> 9) & 8;
  }
  local_20._12_1_ =
       (byte)order >> 3 & 2 | (byte)(order >> 6) & 4 | (byte)order & 1 | bVar1 |
       local_20._12_1_ & 0xe0;
  Imath_2_5::Euler<float>::extract(&local_20,M);
  Imath_2_5::Euler<float>::toMatrix44(__return_storage_ptr__,&local_20);
  return __return_storage_ptr__;
}

Assistant:

M44f
matrixEulerMatrix_2 (const M44f &M, Eulerf::Order order)
{
    Eulerf f (order);
    f.extract (M);
    return f.toMatrix44();
}